

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_tree_nodes.h
# Opt level: O3

void __thiscall
st_tree::detail::
node_base<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>
::_erase(node_base<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>
         *this,iterator *F,iterator *L)

{
  node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>
  **__dest;
  node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>
  **ppnVar1;
  node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int> *pnVar2
  ;
  node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>
  **ppnVar3;
  node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>
  **ppnVar4;
  node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>
  **ppnVar5;
  vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>
  d;
  node_type *n;
  node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>
  **local_58;
  iterator iStack_50;
  node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>
  **local_48;
  node_type *local_40;
  iterator *local_38;
  
  local_58 = (node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>
              **)0x0;
  iStack_50._M_current =
       (node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>
        **)0x0;
  local_48 = (node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>
              **)0x0;
  ppnVar5 = (F->_base)._M_current;
  if ((L->_base)._M_current != ppnVar5) {
    ppnVar3 = ppnVar5;
    local_38 = F;
    do {
      local_40 = *ppnVar5;
      _prune(this,local_40);
      if (iStack_50._M_current == local_48) {
        std::
        vector<st_tree::detail::node_raw<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>,int>*,std::allocator<st_tree::detail::node_raw<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>,int>*>>
        ::
        _M_realloc_insert<st_tree::detail::node_raw<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>,int>*const&>
                  ((vector<st_tree::detail::node_raw<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>,int>*,std::allocator<st_tree::detail::node_raw<st_tree::tree<int,st_tree::raw<st_tree::arg_unused>,std::allocator<int>>,int>*>>
                    *)&local_58,iStack_50,&local_40);
      }
      else {
        *iStack_50._M_current = local_40;
        iStack_50._M_current = iStack_50._M_current + 1;
      }
      ppnVar5 = ppnVar5 + 1;
      ppnVar3 = ppnVar3 + 1;
    } while (ppnVar5 != (L->_base)._M_current);
    __dest = (local_38->_base)._M_current;
    if (ppnVar5 != __dest) {
      ppnVar1 = (this->_children).
                super__Vector_base<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      ppnVar4 = ppnVar3;
      if (ppnVar5 != ppnVar1) {
        memmove(__dest,ppnVar3,(long)ppnVar1 - (long)ppnVar3);
        ppnVar4 = (this->_children).
                  super__Vector_base<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      ppnVar3 = (node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>
                 **)(((long)ppnVar4 + (long)__dest) - (long)ppnVar3);
      if (ppnVar3 != ppnVar4) {
        (this->_children).
        super__Vector_base<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = ppnVar3;
      }
    }
  }
  tree(this);
  ppnVar5 = local_58;
  if (local_58 != iStack_50._M_current) {
    do {
      pnVar2 = *ppnVar5;
      (**(pnVar2->
         super_node_base<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>,_std::vector<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*,_std::allocator<st_tree::detail::node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int>_*>_>_>
         )._vptr_node_base)(pnVar2);
      operator_delete(pnVar2,0x68);
      ppnVar5 = ppnVar5 + 1;
    } while (ppnVar5 != iStack_50._M_current);
  }
  if (local_58 !=
      (node_raw<st_tree::tree<int,_st_tree::raw<st_tree::arg_unused>,_std::allocator<int>_>,_int> **
      )0x0) {
    operator_delete(local_58,(long)local_48 - (long)local_58);
  }
  return;
}

Assistant:

void _erase(const iterator& F, const iterator& L) {
        vector<node_type*> d;
        for (iterator j(F);  j != L;  ++j) {
            node_type* n = &*j;
            _prune(n);
            d.push_back(n);
        }
        _children.erase(F.base(), L.base());
        tree_type& tree_ = this->tree();
        for (typename vector<node_type*>::iterator e(d.begin());  e != d.end();  ++e) tree_._delete_node(*e);
    }